

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

uint __thiscall leveldb::log::Reader::ReadPhysicalRecord(Reader *this,Slice *result)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  char *ptr;
  ulong uVar7;
  Slice *in_RSI;
  Reader *in_RDI;
  size_t drop_size_1;
  uint32_t actual_crc;
  uint32_t expected_crc;
  size_t drop_size;
  uint32_t length;
  uint type;
  uint32_t b;
  uint32_t a;
  char *header;
  Status status;
  size_t in_stack_ffffffffffffff78;
  Status *in_stack_ffffffffffffff80;
  uint64_t uVar8;
  uint64_t in_stack_ffffffffffffff88;
  Slice local_68;
  size_t local_58;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint64_t in_stack_ffffffffffffffb8;
  int local_24;
  Status local_20;
  Slice *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  while (sVar6 = Slice::size(&in_RDI->buffer_), sVar6 < 7) {
    if ((in_RDI->eof_ & 1U) != 0) {
      Slice::clear(&in_RDI->buffer_);
      return 5;
    }
    Slice::clear(&in_RDI->buffer_);
    (*in_RDI->file_->_vptr_SequentialFile[2])
              (&local_20,in_RDI->file_,0x8000,&in_RDI->buffer_,in_RDI->backing_store_);
    sVar6 = Slice::size(&in_RDI->buffer_);
    in_RDI->end_of_buffer_offset_ = sVar6 + in_RDI->end_of_buffer_offset_;
    bVar1 = Status::ok(&local_20);
    if (bVar1) {
      sVar6 = Slice::size(&in_RDI->buffer_);
      if (sVar6 < 0x8000) {
        in_RDI->eof_ = true;
      }
      local_24 = 2;
    }
    else {
      Slice::clear(&in_RDI->buffer_);
      ReportDrop(in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      in_RDI->eof_ = true;
      local_4 = 5;
      local_24 = 1;
    }
    Status::~Status(in_stack_ffffffffffffff80);
    if (local_24 == 1) {
      return local_4;
    }
  }
  ptr = Slice::data(&in_RDI->buffer_);
  uVar2 = (uint)ptr[6];
  uVar3 = (uint)*(ushort *)(ptr + 4);
  uVar7 = (ulong)(uVar3 + 7);
  sVar6 = Slice::size(&in_RDI->buffer_);
  if (sVar6 < uVar7) {
    sVar6 = Slice::size(&in_RDI->buffer_);
    Slice::clear(&in_RDI->buffer_);
    if ((in_RDI->eof_ & 1U) == 0) {
      ReportCorruption((Reader *)CONCAT44(uVar2,uVar3),sVar6,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      return 6;
    }
    return 5;
  }
  if ((uVar2 == 0) && (uVar3 == 0)) {
    Slice::clear(&in_RDI->buffer_);
    return 6;
  }
  if ((in_RDI->checksum_ & 1U) != 0) {
    uVar4 = DecodeFixed32(ptr);
    uVar4 = crc32c::Unmask(uVar4);
    uVar5 = crc32c::Value((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (uVar5 != uVar4) {
      local_58 = Slice::size(&in_RDI->buffer_);
      Slice::clear(&in_RDI->buffer_);
      ReportCorruption((Reader *)CONCAT44(uVar2,uVar3),in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(uVar4,uVar5));
      return 6;
    }
  }
  Slice::remove_prefix(&in_RDI->buffer_,(ulong)(uVar3 + 7));
  uVar8 = in_RDI->end_of_buffer_offset_;
  sVar6 = Slice::size(&in_RDI->buffer_);
  if (((uVar8 - sVar6) + -7) - (ulong)uVar3 < in_RDI->initial_offset_) {
    Slice::clear(local_18);
    return 6;
  }
  Slice::Slice(&local_68,ptr + 7,(ulong)uVar3);
  local_18->data_ = local_68.data_;
  local_18->size_ = local_68.size_;
  return uVar2;
}

Assistant:

unsigned int Reader::ReadPhysicalRecord(Slice* result) {
  while (true) {
    if (buffer_.size() < kHeaderSize) {
      if (!eof_) {
        // Last read was a full read, so this is a trailer to skip
        buffer_.clear();
        Status status = file_->Read(kBlockSize, &buffer_, backing_store_);
        end_of_buffer_offset_ += buffer_.size();
        if (!status.ok()) {
          buffer_.clear();
          ReportDrop(kBlockSize, status);
          eof_ = true;
          return kEof;
        } else if (buffer_.size() < kBlockSize) {
          eof_ = true;
        }
        continue;
      } else {
        // Note that if buffer_ is non-empty, we have a truncated header at the
        // end of the file, which can be caused by the writer crashing in the
        // middle of writing the header. Instead of considering this an error,
        // just report EOF.
        buffer_.clear();
        return kEof;
      }
    }

    // Parse the header
    const char* header = buffer_.data();
    const uint32_t a = static_cast<uint32_t>(header[4]) & 0xff;
    const uint32_t b = static_cast<uint32_t>(header[5]) & 0xff;
    const unsigned int type = header[6];
    const uint32_t length = a | (b << 8);
    if (kHeaderSize + length > buffer_.size()) {
      size_t drop_size = buffer_.size();
      buffer_.clear();
      if (!eof_) {
        ReportCorruption(drop_size, "bad record length");
        return kBadRecord;
      }
      // If the end of the file has been reached without reading |length| bytes
      // of payload, assume the writer died in the middle of writing the record.
      // Don't report a corruption.
      return kEof;
    }

    if (type == kZeroType && length == 0) {
      // Skip zero length record without reporting any drops since
      // such records are produced by the mmap based writing code in
      // env_posix.cc that preallocates file regions.
      buffer_.clear();
      return kBadRecord;
    }

    // Check crc
    if (checksum_) {
      uint32_t expected_crc = crc32c::Unmask(DecodeFixed32(header));
      uint32_t actual_crc = crc32c::Value(header + 6, 1 + length);
      if (actual_crc != expected_crc) {
        // Drop the rest of the buffer since "length" itself may have
        // been corrupted and if we trust it, we could find some
        // fragment of a real log record that just happens to look
        // like a valid log record.
        size_t drop_size = buffer_.size();
        buffer_.clear();
        ReportCorruption(drop_size, "checksum mismatch");
        return kBadRecord;
      }
    }

    buffer_.remove_prefix(kHeaderSize + length);

    // Skip physical record that started before initial_offset_
    if (end_of_buffer_offset_ - buffer_.size() - kHeaderSize - length <
        initial_offset_) {
      result->clear();
      return kBadRecord;
    }

    *result = Slice(header + kHeaderSize, length);
    return type;
  }
}